

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_helper.c
# Opt level: O0

int up_scale_image(uchar *orig,int width,int height,int channels,uchar *resampled,
                  int resampled_width,int resampled_height)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  float fVar5;
  float fVar6;
  int local_5c;
  float value;
  int base_index;
  int intx;
  float samplex;
  int inty;
  float sampley;
  int c;
  int y;
  int x;
  float dy;
  float dx;
  int resampled_width_local;
  uchar *resampled_local;
  int channels_local;
  int height_local;
  int width_local;
  uchar *orig_local;
  
  if ((((width < 1) || (height < 1)) || (resampled_width < 2)) ||
     (((resampled_height < 2 || (channels < 1)) ||
      ((orig == (uchar *)0x0 || (resampled == (uchar *)0x0)))))) {
    orig_local._4_4_ = 0;
  }
  else {
    for (sampley = 0.0; (int)sampley < resampled_height; sampley = (float)((int)sampley + 1)) {
      fVar5 = (float)(int)sampley * (((float)height - 1.0) / ((float)resampled_height - 1.0));
      intx = (int)fVar5;
      if (height + -2 < intx) {
        intx = height + -2;
      }
      fVar5 = fVar5 - (float)intx;
      for (c = 0; c < resampled_width; c = c + 1) {
        fVar6 = (float)c * (((float)width - 1.0) / ((float)resampled_width - 1.0));
        value = (float)(int)fVar6;
        if (width + -2 < (int)value) {
          value = (float)(width + -2);
        }
        fVar6 = fVar6 - (float)(int)value;
        local_5c = (intx * width + (int)value) * channels;
        for (inty = 0; inty < channels; inty = inty + 1) {
          lVar4 = (long)local_5c;
          iVar1 = local_5c + channels;
          iVar2 = local_5c + width * channels;
          iVar3 = local_5c + width * channels;
          local_5c = local_5c + 1;
          resampled[(int)sampley * resampled_width * channels + c * channels + inty] =
               (uchar)(int)((float)orig[iVar3 + channels] * fVar6 * fVar5 +
                           (float)orig[iVar2] * (1.0 - fVar6) * fVar5 +
                           (float)orig[iVar1] * fVar6 * (1.0 - fVar5) +
                           (float)orig[lVar4] * (1.0 - fVar6) * (1.0 - fVar5) + 0.5);
        }
      }
    }
    orig_local._4_4_ = 1;
  }
  return orig_local._4_4_;
}

Assistant:

int
	up_scale_image
	(
		const unsigned char* const orig,
		int width, int height, int channels,
		unsigned char* resampled,
		int resampled_width, int resampled_height
	)
{
	float dx, dy;
	int x, y, c;

    /* error(s) check	*/
    if ( 	(width < 1) || (height < 1) ||
            (resampled_width < 2) || (resampled_height < 2) ||
            (channels < 1) ||
            (NULL == orig) || (NULL == resampled) )
    {
        /*	signify badness	*/
        return 0;
    }
    /*
		for each given pixel in the new map, find the exact location
		from the original map which would contribute to this guy
	*/
    dx = (width - 1.0f) / (resampled_width - 1.0f);
    dy = (height - 1.0f) / (resampled_height - 1.0f);
    for ( y = 0; y < resampled_height; ++y )
    {
    	/* find the base y index and fractional offset from that	*/
    	float sampley = y * dy;
    	int inty = (int)sampley;
    	/*	if( inty < 0 ) { inty = 0; } else	*/
		if( inty > height - 2 ) { inty = height - 2; }
		sampley -= inty;
        for ( x = 0; x < resampled_width; ++x )
        {
			float samplex = x * dx;
			int intx = (int)samplex;
			int base_index;
			/* find the base x index and fractional offset from that	*/
			/*	if( intx < 0 ) { intx = 0; } else	*/
			if( intx > width - 2 ) { intx = width - 2; }
			samplex -= intx;
			/*	base index into the original image	*/
			base_index = (inty * width + intx) * channels;
            for ( c = 0; c < channels; ++c )
            {
            	/*	do the sampling	*/
				float value = 0.5f;
				value += orig[base_index]
							*(1.0f-samplex)*(1.0f-sampley);
				value += orig[base_index+channels]
							*(samplex)*(1.0f-sampley);
				value += orig[base_index+width*channels]
							*(1.0f-samplex)*(sampley);
				value += orig[base_index+width*channels+channels]
							*(samplex)*(sampley);
				/*	move to the next channel	*/
				++base_index;
            	/*	save the new value	*/
            	resampled[y*resampled_width*channels+x*channels+c] =
						(unsigned char)(value);
            }
        }
    }
    /*	done	*/
    return 1;
}